

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O1

void __thiscall
boost::python::
class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
::def_maybe_overloads<boost::python::api::object,char_const*>
          (class_<LFPConsumer_python,boost::python::bases<HFSubConsumer_python,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_,mpl_::void_>,boost::noncopyable_::noncopyable,boost::python::detail::not_specified>
           *this,char *name,object *fn,char **a1,...)

{
  PyObject *pPVar1;
  
  pPVar1 = (fn->super_object_base).m_ptr;
  pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  objects::add_to_namespace((object *)this,name,fn,*a1);
  pPVar1->ob_refcnt = pPVar1->ob_refcnt + -1;
  if (pPVar1->ob_refcnt == 0) {
    _Py_Dealloc();
  }
  return;
}

Assistant:

object make_fn_impl(T*, D B::*pm_, mpl::false_, int*, mpl::true_)
    {
        D T::*pm = pm_;
        return python::make_setter(pm);
    }